

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O0

void __thiscall OpenMPClause::addLangExpr(OpenMPClause *this,char *expression,int line,int col)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppcVar4;
  SourceLocation local_38;
  uint local_24;
  int local_20;
  uint i;
  int col_local;
  int line_local;
  char *expression_local;
  OpenMPClause *this_local;
  
  local_24 = 0;
  local_20 = col;
  i = line;
  _col_local = expression;
  expression_local = (char *)this;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->expressions);
    if (sVar3 <= uVar2) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&this->expressions,(value_type *)&col_local);
      SourceLocation::SourceLocation(&local_38,i,local_20,(SourceLocation *)0x0);
      std::vector<SourceLocation,_std::allocator<SourceLocation>_>::push_back
                (&this->locations,&local_38);
      return;
    }
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at
                        (&this->expressions,(ulong)local_24);
    iVar1 = strcmp(*ppcVar4,_col_local);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void OpenMPClause::addLangExpr(const char *expression, int line, int col) {
    // Since the size of expression vector is supposed to be small, brute force is used here.
    for (unsigned int i = 0; i < this->expressions.size(); i++) {
        if (!strcmp(expressions.at(i), expression)) {
            return;
        };
    };
    expressions.push_back(expression);
    locations.push_back(SourceLocation(line, col));
}